

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

uint32_t ect_predict(ect *e,single_learner *base,example *ec)

{
  uint *puVar1;
  direction *pdVar2;
  long in_RDX;
  ulong *in_RDI;
  uint32_t id;
  uint32_t problem_number;
  size_t i;
  uint32_t finals_winner;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  int in_stack_ffffffffffffffc4;
  example *ec_00;
  undefined4 uVar4;
  undefined4 uVar5;
  uint local_24;
  uint32_t local_4;
  
  if (*in_RDI == 1) {
    local_4 = 1;
  }
  else {
    local_24 = 0;
    uVar4 = 0x7f7fffff;
    uVar5 = 0;
    *(undefined8 *)(in_RDX + 0x6828) = 0x7f7fffff;
    *(undefined4 *)(in_RDX + 0x6830) = 0;
    ec_00 = (example *)in_RDI[0x17];
    while (ec_00 = (example *)((long)(ec_00 + 0xffffffffffffffff) + 0x68cf),
          ec_00 != (example *)0xffffffffffffffff) {
      if (((ulong)local_24 | 1L << ((byte)ec_00 & 0x3f)) <= in_RDI[1]) {
        in_stack_ffffffffffffffc4 = (int)in_RDI[0x18] + (local_24 | 1 << ((byte)ec_00 & 0x1f)) + -1;
        LEARNER::learner<char,_example>::learn
                  ((learner<char,_example> *)CONCAT44(uVar5,uVar4),ec_00,
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (*(float *)(in_RDI + 2) <= *(float *)(in_RDX + 0x6850) &&
            *(float *)(in_RDX + 0x6850) != *(float *)(in_RDI + 2)) {
          local_24 = local_24 | (uint)(1L << ((byte)ec_00 & 0x3f));
        }
      }
    }
    puVar1 = v_array<unsigned_int>::operator[]
                       ((v_array<unsigned_int> *)(in_RDI + 0xb),(ulong)local_24);
    uVar3 = *puVar1;
    while (*in_RDI <= (ulong)uVar3) {
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(uVar5,uVar4),ec_00,
                 CONCAT44(in_stack_ffffffffffffffc4,uVar3));
      if (*(float *)(in_RDX + 0x6850) < *(float *)(in_RDI + 2) ||
          *(float *)(in_RDX + 0x6850) == *(float *)(in_RDI + 2)) {
        pdVar2 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)uVar3);
        uVar3 = pdVar2->left;
      }
      else {
        pdVar2 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)uVar3);
        uVar3 = pdVar2->right;
      }
    }
    local_4 = uVar3 + 1;
  }
  return local_4;
}

Assistant:

uint32_t ect_predict(ect& e, single_learner& base, example& ec)
{
  if (e.k == (size_t)1)
    return 1;

  uint32_t finals_winner = 0;

  // Binary final elimination tournament first
  ec.l.simple = {FLT_MAX, 0., 0.};

  for (size_t i = e.tree_height - 1; i != (size_t)0 - 1; i--)
  {
    if ((finals_winner | (((size_t)1) << i)) <= e.errors)
    {
      // a real choice exists
      uint32_t problem_number = e.last_pair + (finals_winner | (((uint32_t)1) << i)) - 1;  // This is unique.

      base.learn(ec, problem_number);

      if (ec.pred.scalar > e.class_boundary)
        finals_winner = finals_winner | (((size_t)1) << i);
    }
  }

  uint32_t id = e.final_nodes[finals_winner];
  while (id >= e.k)
  {
    base.learn(ec, id - e.k);

    if (ec.pred.scalar > e.class_boundary)
      id = e.directions[id].right;
    else
      id = e.directions[id].left;
  }
  return id + 1;
}